

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::internal::
BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false,_true>
::BlockImpl_dense(BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false,_true>
                  *this,Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *xpr,
                 Index startRow,Index startCol,Index blockRows,Index blockCols)

{
  ScalarWithConstIfNotLvalue *pSVar1;
  Index IVar2;
  Index IVar3;
  Index blockCols_local;
  Index blockRows_local;
  Index startCol_local;
  Index startRow_local;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *xpr_local;
  BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false,_true>
  *this_local;
  
  pSVar1 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1>::data
                     ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                       *)xpr);
  IVar2 = BlockImpl_dense<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false,_true>::
          innerStride((BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                       *)xpr);
  IVar3 = BlockImpl_dense<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false,_true>::
          outerStride((BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                       *)xpr);
  MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>,_1>
  ::MapBase(&this->
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_1>
            ,pSVar1 + IVar2 * startRow + IVar3 * startCol,blockRows,blockCols);
  memcpy(&this->m_xpr,xpr,0x38);
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_startRow,startRow);
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_startCol,startCol);
  init(this,(EVP_PKEY_CTX *)startCol);
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Base(xpr.data()+xpr.innerStride()*(XprTypeIsRowMajor?startCol:startRow) + xpr.outerStride()*(XprTypeIsRowMajor?startRow:startCol), blockRows, blockCols),
        m_xpr(xpr), m_startRow(startRow), m_startCol(startCol)
    {
      init();
    }